

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall opt_Price_Test::opt_Price_Test(opt_Price_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001c6fd0;
  return;
}

Assistant:

TEST(opt, Price)
{
  using price = int;
  using opt_price = opt<price, opt_null_value_policy<price, -1>>;
  static_assert(sizeof(opt_price) == sizeof(int));

  opt_price o1;
  EXPECT_TRUE(static_cast<bool>(o1) == false);
  EXPECT_TRUE(o1.has_value() == false);
  EXPECT_TRUE(o1.value_or(123) == 123);

  opt_price o2{99};
  EXPECT_TRUE(static_cast<bool>(o2) == true);
  EXPECT_TRUE(o2.has_value() == true);
  EXPECT_TRUE(*o2 == 99);
  EXPECT_TRUE(o2.value() == 99);
  EXPECT_TRUE(o2.value_or(123) == 99);

  opt_price o3{o2};
  EXPECT_TRUE(o3.has_value() == true);
  EXPECT_TRUE(*o3 == 99);

  o3 = o1;
  EXPECT_TRUE(o3.has_value() == false);

  o3 = o2;
  EXPECT_TRUE(o3.has_value() == true);
  EXPECT_TRUE(*o3 == 99);

  o3 = nullopt;
  EXPECT_TRUE(o3.has_value() == false);
}